

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

string * __thiscall
t_netstd_generator::normalize_name
          (string *__return_storage_ptr__,t_netstd_generator *this,string *name,bool is_arg_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  int iVar5;
  iterator iVar6;
  size_type sVar7;
  string tmp;
  key_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
  _Var4._M_p = local_50._M_dataplus._M_p;
  if (local_50._M_string_length != 0) {
    sVar7 = 0;
    do {
      iVar5 = tolower((int)_Var4._M_p[sVar7]);
      _Var4._M_p[sVar7] = (char)iVar5;
      sVar7 = sVar7 + 1;
    } while (local_50._M_string_length != sVar7);
  }
  if ((is_arg_name) &&
     (CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length == name->_M_string_length)) {
    if (CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length != 0) {
      iVar5 = bcmp(CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,(name->_M_dataplus)._M_p,
                   CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
      if (iVar5 != 0) goto LAB_002b5b05;
    }
    std::__cxx11::string::append((char *)name);
  }
LAB_002b5b05:
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->netstd_keywords)._M_t,&local_50);
  if ((_Rb_tree_header *)iVar6._M_node ==
      &(this->netstd_keywords)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    paVar1 = &name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&name->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = name->_M_string_length;
    (name->_M_dataplus)._M_p = (pointer)paVar1;
    name->_M_string_length = 0;
    (name->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::operator+(__return_storage_ptr__,"@",name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::normalize_name(string name, bool is_arg_name)
{
    string tmp(name);
    transform(tmp.begin(), tmp.end(), tmp.begin(), static_cast<int(*)(int)>(tolower));

    // check for reserved argument names
    if( is_arg_name && (CANCELLATION_TOKEN_NAME == name))
	{
		name += "_";
	}

    // un-conflict keywords by prefixing with "@"
    if (netstd_keywords.find(tmp) != netstd_keywords.end())
    {
        return "@" + name;
    }
	
    // no changes necessary
    return name;
}